

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
base_iterator_matrix_sparse_element_test::SetUp(base_iterator_matrix_sparse_element_test *this)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  double local_70 [5];
  iterator local_48;
  undefined8 local_40;
  int local_34 [5];
  iterator local_20;
  undefined8 local_18;
  base_iterator_matrix_sparse_element_test *local_10;
  base_iterator_matrix_sparse_element_test *this_local;
  
  local_34[0] = 0;
  local_34[1] = 1;
  local_34[2] = 2;
  local_34[3] = 3;
  local_34[4] = 4;
  local_20 = local_34;
  local_18 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_20;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::operator=(&this->columns,__l_00);
  memcpy(local_70,&DAT_00183658,0x28);
  local_48 = local_70;
  local_40 = 5;
  __l._M_len = 5;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::operator=(&this->entries,__l);
  return;
}

Assistant:

void SetUp() override {
    // Set up test data
    columns = {0, 1, 2, 3, 4};
    entries = {1.0, 2.0, 3.0, 4.0, 5.0};
  }